

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

cmListFileContext *
cmConditionEvaluator::GetConditionContext
          (cmListFileContext *__return_storage_ptr__,cmMakefile *mf,cmCommandContext *command,
          string *filePath)

{
  Snapshot snapshot;
  bool bVar1;
  cmake *this;
  cmOutputConverter converter;
  string local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  PositionType local_40;
  cmOutputConverter local_38;
  
  cmListFileContext::FromCommandContext(__return_storage_ptr__,command,filePath);
  this = cmMakefile::GetCMakeInstance(mf);
  bVar1 = cmake::GetIsInTryCompile(this);
  if (!bVar1) {
    cmMakefile::GetStateSnapshot(mf);
    snapshot.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)uStack_48;
    snapshot.State = (cmState *)local_50;
    snapshot.Position.Position = local_40;
    cmOutputConverter::cmOutputConverter(&local_38,snapshot);
    cmOutputConverter::Convert(&local_70,&local_38,&__return_storage_ptr__->FilePath,HOME,UNCHANGED)
    ;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)&local_70)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmConditionEvaluator::GetConditionContext(
    cmMakefile* mf,
    const cmCommandContext& command,
    const std::string& filePath)
{
  cmListFileContext context =
      cmListFileContext::FromCommandContext(
        command,
        filePath);

  if(!mf->GetCMakeInstance()->GetIsInTryCompile())
    {
    cmOutputConverter converter(mf->GetStateSnapshot());
    context.FilePath = converter.Convert(context.FilePath,
                                         cmOutputConverter::HOME);
    }
  return context;
}